

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  pointer ppDVar4;
  
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppDVar2 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppDVar4 = ppDVar2;
    if (ppDVar4 == ppDVar1) break;
    iVar3 = (*(*ppDVar4)->_vptr_DescriptorDatabase[2])(*ppDVar4,filename,output);
    ppDVar2 = ppDVar4 + 1;
  } while ((char)iVar3 == '\0');
  return ppDVar4 != ppDVar1;
}

Assistant:

bool MergedDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  for (DescriptorDatabase* source : sources_) {
    if (source->FindFileByName(filename, output)) {
      return true;
    }
  }
  return false;
}